

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  __m256i *palVar8;
  __m256i c;
  __m256i c_00;
  undefined4 uVar9;
  int iVar10;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar11;
  __m256i *b_00;
  __m256i *palVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong size;
  long lVar17;
  __m256i *ptr;
  long lVar18;
  long lVar19;
  uint uVar20;
  undefined4 uVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 in_stack_fffffffffffffe48 [12];
  undefined2 in_stack_fffffffffffffe54;
  short sVar41;
  undefined2 in_stack_fffffffffffffe56;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int iVar42;
  undefined4 in_stack_fffffffffffffe64;
  __m256i *local_170;
  undefined1 auVar28 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_sw_table_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_16_cold_4();
        }
        else {
          uVar14 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_1();
          }
          else {
            uVar1 = (ulong)uVar16 + 0xf;
            iVar10 = ppVar3->max;
            uVar20 = (uint)uVar1 & 0x7ffffff0;
            result = parasail_result_new_table1(uVar20,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 4;
              result->flag = result->flag | 0x10220804;
              b = parasail_memalign___m256i(0x20,size);
              palVar11 = parasail_memalign___m256i(0x20,size);
              local_170 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              if ((b_00 != (__m256i *)0x0 && local_170 != (__m256i *)0x0) &&
                  (palVar11 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                uVar25 = (undefined2)open;
                uVar26 = (undefined2)gap;
                c[1]._4_2_ = in_stack_fffffffffffffe54;
                c._0_12_ = in_stack_fffffffffffffe48;
                c[1]._6_2_ = in_stack_fffffffffffffe56;
                c[2] = in_stack_fffffffffffffe58;
                c[3]._0_4_ = in_stack_fffffffffffffe60;
                c[3]._4_4_ = in_stack_fffffffffffffe64;
                parasail_memset___m256i(b,c,size);
                c_00[1]._4_2_ = in_stack_fffffffffffffe54;
                c_00._0_12_ = in_stack_fffffffffffffe48;
                c_00[1]._6_2_ = in_stack_fffffffffffffe56;
                c_00[2] = in_stack_fffffffffffffe58;
                c_00[3]._0_4_ = in_stack_fffffffffffffe60;
                c_00[3]._4_4_ = in_stack_fffffffffffffe64;
                parasail_memset___m256i(b_00,c_00,size);
                auVar6._2_2_ = uVar26;
                auVar6._0_2_ = uVar26;
                auVar6._4_2_ = uVar26;
                auVar6._6_2_ = uVar26;
                auVar6._8_2_ = uVar26;
                auVar6._10_2_ = uVar26;
                auVar6._12_2_ = uVar26;
                auVar6._14_2_ = uVar26;
                auVar6._16_2_ = uVar26;
                auVar6._18_2_ = uVar26;
                auVar6._20_2_ = uVar26;
                auVar6._22_2_ = uVar26;
                auVar6._24_2_ = uVar26;
                auVar6._26_2_ = uVar26;
                auVar6._28_2_ = uVar26;
                auVar6._30_2_ = uVar26;
                auVar5._2_2_ = uVar25;
                auVar5._0_2_ = uVar25;
                auVar5._4_2_ = uVar25;
                auVar5._6_2_ = uVar25;
                auVar5._8_2_ = uVar25;
                auVar5._10_2_ = uVar25;
                auVar5._12_2_ = uVar25;
                auVar5._14_2_ = uVar25;
                auVar5._16_2_ = uVar25;
                auVar5._18_2_ = uVar25;
                auVar5._20_2_ = uVar25;
                auVar5._22_2_ = uVar25;
                auVar5._24_2_ = uVar25;
                auVar5._26_2_ = uVar25;
                auVar5._28_2_ = uVar25;
                auVar5._30_2_ = uVar25;
                iVar7 = (int)size;
                lVar17 = size * uVar14;
                auVar27._8_2_ = 0x8000;
                auVar27._0_8_ = 0x8000800080008000;
                auVar27._10_2_ = 0x8000;
                auVar27._12_2_ = 0x8000;
                auVar27._14_2_ = 0x8000;
                auVar28._16_2_ = 0x8000;
                auVar28._0_16_ = auVar27;
                auVar28._18_2_ = 0x8000;
                auVar28._20_2_ = 0x8000;
                auVar28._22_2_ = 0x8000;
                auVar28._24_2_ = 0x8000;
                auVar28._26_2_ = 0x8000;
                auVar28._28_2_ = 0x8000;
                auVar28._30_2_ = 0x8000;
                auVar30._8_2_ = 0x8000;
                auVar30._0_8_ = 0x8000800080008000;
                auVar30._10_2_ = 0x8000;
                auVar30._12_2_ = 0x8000;
                auVar30._14_2_ = 0x8000;
                auVar34 = ZEXT3264(auVar28);
                auVar33 = ZEXT3264(auVar28);
                sVar41 = -0x8000;
                lVar19 = 0;
                uVar13 = 0;
                uVar23 = 0;
                do {
                  ptr = b;
                  iVar42 = ppVar3->mapper[(byte)s2[uVar13]];
                  iVar22 = (int)uVar23;
                  palVar12 = local_170;
                  b = palVar11;
                  if (iVar22 == (int)uVar13 + -2) {
                    palVar12 = palVar11;
                    b = local_170;
                  }
                  auVar31 = SUB3216(ptr[iVar7 - 1],0);
                  auVar40._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar27;
                  auVar40._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar31;
                  auVar40 = vpalignr_avx2((undefined1  [32])ptr[iVar7 - 1],auVar40,0xe);
                  auVar31 = vpblendw_avx(auVar40._0_16_,auVar27,1);
                  auVar40 = vpblendd_avx2(ZEXT1632(auVar31),auVar40,0xf0);
                  lVar18 = 0;
                  auVar38 = ZEXT3264(auVar28);
                  lVar15 = lVar19;
                  do {
                    auVar35 = vpaddsw_avx2(auVar40,*(undefined1 (*) [32])
                                                    ((long)pvVar2 +
                                                    lVar18 + size * (long)iVar42 * 0x20));
                    auVar40 = *(undefined1 (*) [32])((long)*b_00 + lVar18);
                    auVar36 = vpmaxsw_avx2(auVar40,auVar38._0_32_);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    *(undefined1 (*) [32])((long)*b + lVar18) = auVar35;
                    piVar4 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar4 + lVar15) = auVar35._0_2_ + 0x8000;
                    auVar31 = auVar35._0_16_;
                    uVar9 = vpextrw_avx(auVar31,1);
                    *(int *)((long)piVar4 + lVar17 * 4 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,2);
                    uVar21 = vpextrw_avx(auVar31,3);
                    *(int *)((long)piVar4 + lVar17 * 8 + lVar15) = (short)uVar9 + 0x8000;
                    *(int *)((long)piVar4 + lVar17 * 0xc + lVar15) = (short)uVar21 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,4);
                    *(int *)((long)piVar4 + lVar17 * 0x10 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,5);
                    *(int *)((long)piVar4 + lVar17 * 0x14 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,6);
                    uVar21 = vpextrw_avx(auVar31,7);
                    *(int *)((long)piVar4 + lVar17 * 0x18 + lVar15) = (short)uVar9 + 0x8000;
                    *(int *)((long)piVar4 + lVar17 * 0x1c + lVar15) = (short)uVar21 + 0x8000;
                    auVar31 = auVar35._16_16_;
                    *(int *)((long)piVar4 + lVar17 * 0x20 + lVar15) = auVar35._16_2_ + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,1);
                    *(int *)((long)piVar4 + lVar17 * 0x24 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,2);
                    uVar21 = vpextrw_avx(auVar31,3);
                    *(int *)((long)piVar4 + lVar17 * 0x28 + lVar15) = (short)uVar9 + 0x8000;
                    *(int *)((long)piVar4 + lVar17 * 0x2c + lVar15) = (short)uVar21 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,4);
                    *(int *)((long)piVar4 + lVar17 * 0x30 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,5);
                    *(int *)((long)piVar4 + lVar17 * 0x34 + lVar15) = (short)uVar9 + 0x8000;
                    uVar9 = vpextrw_avx(auVar31,6);
                    uVar21 = vpextrw_avx(auVar31,7);
                    *(int *)((long)piVar4 + lVar17 * 0x38 + lVar15) = (short)uVar9 + 0x8000;
                    *(int *)((long)piVar4 + lVar17 * 0x3c + lVar15) = (short)uVar21 + 0x8000;
                    auVar36 = vpmaxsw_avx2(auVar35,auVar33._0_32_);
                    auVar33 = ZEXT3264(auVar36);
                    auVar35 = vpsubsw_avx2(auVar35,auVar5);
                    auVar40 = vpsubsw_avx2(auVar40,auVar6);
                    auVar40 = vpmaxsw_avx2(auVar40,auVar35);
                    *(undefined1 (*) [32])((long)*b_00 + lVar18) = auVar40;
                    auVar40 = vpsubsw_avx2(auVar38._0_32_,auVar6);
                    auVar40 = vpmaxsw_avx2(auVar40,auVar35);
                    auVar38 = ZEXT3264(auVar40);
                    auVar40 = *(undefined1 (*) [32])((long)*ptr + lVar18);
                    lVar18 = lVar18 + 0x20;
                    lVar15 = lVar15 + uVar14 * 4;
                  } while (size << 5 != lVar18);
                  iVar42 = 0;
                  do {
                    auVar35._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar27;
                    auVar35._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar38._0_16_;
                    auVar40 = vpalignr_avx2(auVar38._0_32_,auVar35,0xe);
                    auVar31 = vpblendw_avx(auVar40._0_16_,auVar30,1);
                    auVar40 = vpblendd_avx2(ZEXT1632(auVar31),auVar40,0xf0);
                    auVar38 = ZEXT3264(auVar40);
                    lVar18 = 0;
                    lVar15 = lVar19;
                    do {
                      auVar40 = vpmaxsw_avx2(auVar38._0_32_,
                                             *(undefined1 (*) [32])((long)*b + lVar18));
                      *(undefined1 (*) [32])((long)*b + lVar18) = auVar40;
                      piVar4 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar15) = auVar40._0_2_ + 0x8000;
                      auVar31 = auVar40._0_16_;
                      uVar9 = vpextrw_avx(auVar31,1);
                      *(int *)((long)piVar4 + lVar17 * 4 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,2);
                      *(int *)((long)piVar4 + lVar17 * 8 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,3);
                      *(int *)((long)piVar4 + lVar17 * 0xc + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,4);
                      uVar21 = vpextrw_avx(auVar31,5);
                      *(int *)((long)piVar4 + lVar17 * 0x10 + lVar15) = (short)uVar9 + 0x8000;
                      *(int *)((long)piVar4 + lVar17 * 0x14 + lVar15) = (short)uVar21 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,6);
                      *(int *)((long)piVar4 + lVar17 * 0x18 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,7);
                      *(int *)((long)piVar4 + lVar17 * 0x1c + lVar15) = (short)uVar9 + 0x8000;
                      auVar31 = auVar40._16_16_;
                      uVar9 = vpextrw_avx(auVar31,1);
                      *(int *)((long)piVar4 + lVar17 * 0x20 + lVar15) = auVar40._16_2_ + 0x8000;
                      *(int *)((long)piVar4 + lVar17 * 0x24 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,2);
                      *(int *)((long)piVar4 + lVar17 * 0x28 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,3);
                      *(int *)((long)piVar4 + lVar17 * 0x2c + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,4);
                      uVar21 = vpextrw_avx(auVar31,5);
                      *(int *)((long)piVar4 + lVar17 * 0x30 + lVar15) = (short)uVar9 + 0x8000;
                      *(int *)((long)piVar4 + lVar17 * 0x34 + lVar15) = (short)uVar21 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,6);
                      *(int *)((long)piVar4 + lVar17 * 0x38 + lVar15) = (short)uVar9 + 0x8000;
                      uVar9 = vpextrw_avx(auVar31,7);
                      *(int *)((long)piVar4 + lVar17 * 0x3c + lVar15) = (short)uVar9 + 0x8000;
                      auVar35 = vpmaxsw_avx2(auVar40,auVar33._0_32_);
                      auVar33 = ZEXT3264(auVar35);
                      auVar40 = vpsubsw_avx2(auVar40,auVar5);
                      auVar36 = vpsubsw_avx2(auVar38._0_32_,auVar6);
                      auVar38 = ZEXT3264(auVar36);
                      auVar40 = vpcmpgtw_avx2(auVar36,auVar40);
                      if ((((((((((((((((((((((((((((((((auVar40 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar40 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar40 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar40 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar40 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar40 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar40 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar40 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar40 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar40 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar40 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar40 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar40 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar40 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar40 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar40 >> 0x7f,0) == '\0') &&
                                        (auVar40 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar40 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar40 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar40 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar40 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar40 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar40 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar40 >> 0xbf,0) == '\0') &&
                                (auVar40 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar40 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar40 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar40 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar40 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar40 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar40 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar40[0x1f]) goto LAB_007c4f26;
                      lVar18 = lVar18 + 0x20;
                      lVar15 = lVar15 + uVar14 * 4;
                    } while (size << 5 != lVar18);
                    iVar42 = iVar42 + 1;
                  } while (iVar42 != 0x10);
LAB_007c4f26:
                  auVar40 = vpcmpgtw_avx2(auVar35,auVar34._0_32_);
                  if ((((((((((((((((((((((((((((((((auVar40 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar40 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar40 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar40 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar40 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar40 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar40 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar40 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar40 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar40 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar40 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar40 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar40 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar40 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar40 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar40 >> 0x7f,0) != '\0')
                                    || (auVar40 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar40 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar40 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar40 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar40 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar40 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar40 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar40 >> 0xbf,0) != '\0') ||
                            (auVar40 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar40 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar40 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar40 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar40 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar40 = vpermq_avx2(auVar35,0x44);
                    auVar40 = vpmaxsw_avx2(auVar35,auVar40);
                    auVar35 = vpslldq_avx2(auVar40,8);
                    auVar40 = vpmaxsw_avx2(auVar40,auVar35);
                    auVar35 = vpslldq_avx2(auVar40,4);
                    auVar40 = vpmaxsw_avx2(auVar40,auVar35);
                    auVar35 = vpslldq_avx2(auVar40,2);
                    auVar40 = vpmaxsw_avx2(auVar40,auVar35);
                    uVar9 = vpextrw_avx(auVar40._16_16_,7);
                    sVar41 = (short)uVar9;
                    if ((short)(0x7ffe - (short)iVar10) < sVar41) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      s2Len = (int)uVar13;
                      break;
                    }
                    auVar40 = vpshufhw_avx2(auVar40,0xff);
                    auVar36._8_4_ = 6;
                    auVar36._0_8_ = 0x600000006;
                    auVar36._12_4_ = 6;
                    auVar36._16_4_ = 6;
                    auVar36._20_4_ = 6;
                    auVar36._24_4_ = 6;
                    auVar36._28_4_ = 6;
                    auVar40 = vpermd_avx2(auVar36,auVar40);
                    auVar34 = ZEXT3264(auVar40);
                    uVar23 = uVar13 & 0xffffffff;
                  }
                  iVar22 = (int)uVar23;
                  uVar13 = uVar13 + 1;
                  lVar19 = lVar19 + 4;
                  palVar11 = ptr;
                  local_170 = palVar12;
                } while (uVar13 != uVar14);
                if (sVar41 == 0x7fff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar10 = parasail_result_is_saturated(result);
                palVar11 = palVar12;
                if (iVar10 == 0) {
                  palVar8 = ptr;
                  if (iVar22 == s2Len + -2) {
                    palVar11 = ptr;
                    palVar8 = palVar12;
                  }
                  if (iVar22 == s2Len + -1) {
                    palVar11 = b;
                    b = palVar12;
                    palVar8 = ptr;
                  }
                  ptr = palVar8;
                  uVar16 = uVar16 - 1;
                  bVar24 = (uVar1 & 0x7ffffff0) == 0;
                  if (!bVar24) {
                    if (bVar24) {
                      uVar14 = 0;
                      do {
                        uVar20 = (uint)(uVar14 >> 4) & 0xfffffff;
                        if ((int)uVar16 <= (int)uVar20) {
                          uVar20 = uVar16;
                        }
                        if (*(short *)((long)*palVar11 + uVar14 * 2) == sVar41) {
                          uVar16 = uVar20;
                        }
                        uVar14 = uVar14 + 1;
                      } while ((int)uVar14 != 0);
                    }
                    else {
                      auVar29._4_4_ = uVar16;
                      auVar29._0_4_ = uVar16;
                      auVar29._8_4_ = uVar16;
                      auVar29._12_4_ = uVar16;
                      auVar29._16_4_ = uVar16;
                      auVar29._20_4_ = uVar16;
                      auVar29._24_4_ = uVar16;
                      auVar29._28_4_ = uVar16;
                      auVar31._2_2_ = sVar41;
                      auVar31._0_2_ = sVar41;
                      auVar31._4_2_ = sVar41;
                      auVar31._6_2_ = sVar41;
                      auVar31._8_2_ = sVar41;
                      auVar31._10_2_ = sVar41;
                      auVar31._12_2_ = sVar41;
                      auVar31._14_2_ = sVar41;
                      auVar32._4_4_ = iVar7;
                      auVar32._0_4_ = iVar7;
                      auVar32._8_4_ = iVar7;
                      auVar32._12_4_ = iVar7;
                      auVar32._16_4_ = iVar7;
                      auVar32._20_4_ = iVar7;
                      auVar32._24_4_ = iVar7;
                      auVar32._28_4_ = iVar7;
                      auVar6 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                      uVar14 = 0;
                      auVar37._8_4_ = 0xf;
                      auVar37._0_8_ = 0xf0000000f;
                      auVar37._12_4_ = 0xf;
                      auVar37._16_4_ = 0xf;
                      auVar37._20_4_ = 0xf;
                      auVar37._24_4_ = 0xf;
                      auVar37._28_4_ = 0xf;
                      auVar39._8_4_ = 8;
                      auVar39._0_8_ = 0x800000008;
                      auVar39._12_4_ = 8;
                      auVar39._16_4_ = 8;
                      auVar39._20_4_ = 8;
                      auVar39._24_4_ = 8;
                      auVar39._28_4_ = 8;
                      do {
                        auVar27 = vpcmpeqw_avx(auVar31,*(undefined1 (*) [16])
                                                        ((long)*palVar11 + uVar14 * 2));
                        auVar28 = vpmovsxwd_avx2(auVar27);
                        auVar40 = vpsrld_avx2(auVar6,4);
                        auVar5 = vpand_avx2(auVar6,auVar37);
                        auVar5 = vpmulld_avx2(auVar5,auVar32);
                        auVar5 = vpaddd_avx2(auVar5,auVar40);
                        auVar5 = vpminsd_avx2(auVar5,auVar29);
                        auVar29 = vblendvps_avx(auVar29,auVar5,auVar28);
                        uVar14 = uVar14 + 8;
                        auVar6 = vpaddd_avx2(auVar6,auVar39);
                      } while (uVar20 != uVar14);
                      auVar27 = vpminsd_avx(auVar29._0_16_,auVar29._16_16_);
                      auVar30 = vpshufd_avx(auVar27,0xee);
                      auVar27 = vpminsd_avx(auVar27,auVar30);
                      auVar30 = vpshufd_avx(auVar27,0x55);
                      auVar27 = vpminsd_avx(auVar27,auVar30);
                      uVar16 = auVar27._0_4_;
                    }
                  }
                  iVar10 = sVar41 + 0x8000;
                }
                else {
                  iVar22 = 0;
                  iVar10 = 0xffff;
                  uVar16 = 0;
                }
                result->score = iVar10;
                result->end_query = uVar16;
                result->end_ref = iVar22;
                parasail_free(b_00);
                parasail_free(palVar11);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}